

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh8_factory.cpp
# Opt level: O1

Accel * __thiscall
embree::BVH8Factory::BVH8Triangle4
          (BVH8Factory *this,Scene *scene,BuildVariant bvariant,IntersectVariant ivariant)

{
  long lVar1;
  int iVar2;
  BVH8 *bvh;
  Builder *pBVar3;
  Accel *pAVar4;
  undefined8 *puVar5;
  long *plVar6;
  long *plVar7;
  bool bVar8;
  size_t sVar9;
  Intersectors intersectors;
  long *local_178;
  long local_168;
  undefined4 uStack_160;
  undefined4 uStack_15c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  Intersectors local_138;
  
  bvh = (BVH8 *)alignedMalloc(0x240,0x10);
  BVHN<8>::BVHN((BVHN<8> *)bvh,(PrimitiveType *)&TriangleM<4>::type,scene);
  BVH8Triangle4Intersectors(&local_138,this,bvh,ivariant);
  iVar2 = std::__cxx11::string::compare
                    ((char *)(*(long *)&(scene->super_AccelN).field_0x188 + 0x30));
  if (iVar2 == 0) {
    if (bvariant != STATIC) {
      if (bvariant == DYNAMIC) {
LAB_00c8132b:
        bVar8 = false;
LAB_00c81333:
        pBVar3 = (*this->BVH8BuilderTwoLevelTriangle4MeshSAH)(bvh,scene,bVar8);
        goto LAB_00c81356;
      }
      if (bvariant != HIGH_QUALITY) {
        pBVar3 = (Builder *)0x0;
        goto LAB_00c81356;
      }
LAB_00c81310:
      pBVar3 = (*this->BVH8Triangle4SceneBuilderFastSpatialSAH)(bvh,scene,0);
      goto LAB_00c81356;
    }
LAB_00c81321:
    sVar9 = 0;
  }
  else {
    iVar2 = std::__cxx11::string::compare
                      ((char *)(*(long *)&(scene->super_AccelN).field_0x188 + 0x30));
    if (iVar2 == 0) goto LAB_00c81321;
    iVar2 = std::__cxx11::string::compare
                      ((char *)(*(long *)&(scene->super_AccelN).field_0x188 + 0x30));
    if (iVar2 == 0) goto LAB_00c81310;
    iVar2 = std::__cxx11::string::compare
                      ((char *)(*(long *)&(scene->super_AccelN).field_0x188 + 0x30));
    if (iVar2 != 0) {
      iVar2 = std::__cxx11::string::compare
                        ((char *)(*(long *)&(scene->super_AccelN).field_0x188 + 0x30));
      if (iVar2 == 0) goto LAB_00c8132b;
      iVar2 = std::__cxx11::string::compare
                        ((char *)(*(long *)&(scene->super_AccelN).field_0x188 + 0x30));
      if (iVar2 != 0) {
        puVar5 = (undefined8 *)__cxa_allocate_exception(0x30);
        std::operator+(&local_158,"unknown builder ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (*(long *)&(scene->super_AccelN).field_0x188 + 0x30));
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_158);
        local_178 = (long *)*plVar6;
        plVar7 = plVar6 + 2;
        if (local_178 == plVar7) {
          local_168 = *plVar7;
          uStack_160 = (undefined4)plVar6[3];
          uStack_15c = *(undefined4 *)((long)plVar6 + 0x1c);
          local_178 = &local_168;
        }
        else {
          local_168 = *plVar7;
        }
        lVar1 = plVar6[1];
        *plVar6 = (long)plVar7;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        *puVar5 = &PTR__rtcore_error_022018b0;
        *(undefined4 *)(puVar5 + 1) = 2;
        puVar5[2] = puVar5 + 4;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(puVar5 + 2),local_178,lVar1 + (long)local_178);
        __cxa_throw(puVar5,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
      }
      bVar8 = true;
      goto LAB_00c81333;
    }
    sVar9 = 0x100;
  }
  pBVar3 = (*this->BVH8Triangle4SceneBuilderSAH)(bvh,scene,sVar9);
LAB_00c81356:
  pAVar4 = (Accel *)alignedMalloc(0x180,0x10);
  (pAVar4->super_AccelData).super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  *(undefined8 *)&(pAVar4->super_AccelData).bounds.bounds0.lower.field_0 = 0x7f8000007f800000;
  *(undefined8 *)((long)&(pAVar4->super_AccelData).bounds.bounds0.lower.field_0 + 8) =
       0x7f8000007f800000;
  *(undefined8 *)&(pAVar4->super_AccelData).bounds.bounds0.upper.field_0 = 0xff800000ff800000;
  *(undefined8 *)((long)&(pAVar4->super_AccelData).bounds.bounds0.upper.field_0 + 8) =
       0xff800000ff800000;
  *(undefined8 *)&(pAVar4->super_AccelData).bounds.bounds1.lower.field_0 = 0x7f8000007f800000;
  *(undefined8 *)((long)&(pAVar4->super_AccelData).bounds.bounds1.lower.field_0 + 8) =
       0x7f8000007f800000;
  *(undefined8 *)&(pAVar4->super_AccelData).bounds.bounds1.upper.field_0 = 0xff800000ff800000;
  *(undefined8 *)((long)&(pAVar4->super_AccelData).bounds.bounds1.upper.field_0 + 8) =
       0xff800000ff800000;
  (pAVar4->super_AccelData).type = TY_ACCEL_INSTANCE;
  (pAVar4->super_AccelData).super_RefCount._vptr_RefCount = (_func_int **)&PTR__RefCount_02207ae8;
  memcpy(&(pAVar4->super_AccelData).field_0x58,&local_138,0x118);
  (pAVar4->super_AccelData).super_RefCount._vptr_RefCount =
       (_func_int **)&PTR__AccelInstance_02207a80;
  pAVar4[1].super_AccelData.super_RefCount._vptr_RefCount = (_func_int **)bvh;
  pAVar4[1].super_AccelData.super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i =
       (__int_type_conflict)pBVar3;
  return pAVar4;
}

Assistant:

Accel* BVH8Factory::BVH8Triangle4(Scene* scene, BuildVariant bvariant, IntersectVariant ivariant)
  {
    BVH8* accel = new BVH8(Triangle4::type,scene);
    Accel::Intersectors intersectors= BVH8Triangle4Intersectors(accel,ivariant);
    Builder* builder = nullptr;
    if (scene->device->tri_builder == "default")  {
      switch (bvariant) {
      case BuildVariant::STATIC      : builder = BVH8Triangle4SceneBuilderSAH(accel,scene,0); break;
      case BuildVariant::DYNAMIC     : builder = BVH8BuilderTwoLevelTriangle4MeshSAH(accel,scene,false); break;
      case BuildVariant::HIGH_QUALITY: builder = BVH8Triangle4SceneBuilderFastSpatialSAH(accel,scene,0); break;
      }
    }
    else if (scene->device->tri_builder == "sah"         )  builder = BVH8Triangle4SceneBuilderSAH(accel,scene,0);
    else if (scene->device->tri_builder == "sah_fast_spatial")  builder = BVH8Triangle4SceneBuilderFastSpatialSAH(accel,scene,0);
    else if (scene->device->tri_builder == "sah_presplit")     builder = BVH8Triangle4SceneBuilderSAH(accel,scene,MODE_HIGH_QUALITY);
    else if (scene->device->tri_builder == "dynamic"     ) builder = BVH8BuilderTwoLevelTriangle4MeshSAH(accel,scene,false);
    else if (scene->device->tri_builder == "morton"     ) builder = BVH8BuilderTwoLevelTriangle4MeshSAH(accel,scene,true);
    else throw_RTCError(RTC_ERROR_INVALID_ARGUMENT,"unknown builder "+scene->device->tri_builder+" for BVH8<Triangle4>");

    return new AccelInstance(accel,builder,intersectors);
  }